

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void * lj_mem_realloc(lua_State *L,void *p,GCSize osz,GCSize nsz)

{
  ulong uVar1;
  void *pvVar2;
  uint in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  global_State *g;
  
  uVar1 = (ulong)*(uint *)(in_RDI + 8);
  *(int *)(uVar1 + 0x18c) = (int)in_RDI;
  pvVar2 = (void *)(**(code **)(uVar1 + 0x40))(*(undefined8 *)(uVar1 + 0x48),in_RSI,in_EDX,in_ECX);
  if ((pvVar2 == (void *)0x0) && (in_ECX != 0)) {
    lj_err_mem((lua_State *)CONCAT44(in_EDX,in_ECX));
  }
  *(uint *)(uVar1 + 0x50) = (*(int *)(uVar1 + 0x50) - in_EDX) + in_ECX;
  *(ulong *)(uVar1 + 0x98) = (ulong)in_ECX + *(long *)(uVar1 + 0x98);
  *(ulong *)(uVar1 + 0x90) = (ulong)in_EDX + *(long *)(uVar1 + 0x90);
  return pvVar2;
}

Assistant:

void *lj_mem_realloc(lua_State *L, void *p, GCSize osz, GCSize nsz)
{
  global_State *g = G(L);
  lj_assertG((osz == 0) == (p == NULL), "realloc API violation");

  setgcref(g->mem_L, obj2gco(L));
  p = g->allocf(g->allocd, p, osz, nsz);
  if (p == NULL && nsz > 0)
    lj_err_mem(L);
  lj_assertG((nsz == 0) == (p == NULL), "allocf API violation");
  lj_assertG(checkptrGC(p),
	     "allocated memory address %p outside required range", p);
  g->gc.total = (g->gc.total - osz) + nsz;
  g->gc.allocated += nsz;
  g->gc.freed += osz;
  return p;
}